

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O1

wchar_t el_winsertstr(EditLine *el,wchar_t *s)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t addlen;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  wVar1 = L'\xffffffff';
  if ((s != (wchar_t *)0x0) && (addlen = wcslen(s), addlen != 0)) {
    if (((el->el_line).limit <= (el->el_line).lastchar + addlen) &&
       (wVar1 = ch_enlargebufs(el,addlen), wVar1 == L'\0')) {
      return L'\xffffffff';
    }
    c_insert(el,(wchar_t)addlen);
    wVar2 = *s;
    wVar1 = L'\0';
    if (wVar2 != L'\0') {
      pwVar3 = (el->el_line).cursor;
      pwVar4 = s + 1;
      do {
        *pwVar3 = wVar2;
        pwVar3 = pwVar3 + 1;
        wVar2 = *pwVar4;
        pwVar4 = pwVar4 + 1;
      } while (wVar2 != L'\0');
      (el->el_line).cursor = pwVar3;
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

int
el_winsertstr(EditLine *el, const wchar_t *s)
{
	size_t len;

	if (s == NULL || (len = wcslen(s)) == 0)
		return -1;
	if (el->el_line.lastchar + len >= el->el_line.limit) {
		if (!ch_enlargebufs(el, len))
			return -1;
	}

	c_insert(el, (int)len);
	while (*s)
		*el->el_line.cursor++ = *s++;
	return 0;
}